

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_first_of(StringPiece *this,StringPiece s,size_type pos)

{
  long in_RCX;
  bool *in_RDX;
  long *in_RDI;
  stringpiece_ssize_type i;
  bool lookup [256];
  StringPiece *in_stack_fffffffffffffec0;
  StringPiece in_stack_fffffffffffffed8;
  stringpiece_ssize_type local_8;
  
  if ((in_RDI[1] < 1) || ((long)in_RDX < 1)) {
    local_8 = -1;
  }
  else if (in_RDX == (bool *)0x1) {
    local_8 = find_first_of(in_stack_fffffffffffffec0,(char)((ulong)in_RDI >> 0x38),0x40aeaf);
  }
  else {
    memset(&stack0xfffffffffffffed8,0,0x100);
    BuildLookupTable(in_stack_fffffffffffffed8,in_RDX);
    for (; in_RCX < in_RDI[1]; in_RCX = in_RCX + 1) {
      if (((&stack0xfffffffffffffed8)[*(byte *)(*in_RDI + in_RCX)] & 1) != 0) {
        return in_RCX;
      }
    }
    local_8 = -1;
  }
  return local_8;
}

Assistant:

stringpiece_ssize_type StringPiece::find_first_of(StringPiece s,
                                                  size_type pos) const {
  if (length_ <= 0 || s.length_ <= 0) {
    return npos;
  }
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_first_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (stringpiece_ssize_type i = pos; i < length_; ++i) {
    if (lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}